

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O3

void gauden_free(gauden_t *g)

{
  vector_t ***ppppfVar1;
  
  if (g != (gauden_t *)0x0) {
    ppppfVar1 = g->mean;
    if (ppppfVar1 != (vector_t ***)0x0) {
      ckd_free(***ppppfVar1);
      ckd_free_3d(ppppfVar1);
    }
    ppppfVar1 = g->var;
    if (ppppfVar1 != (vector_t ***)0x0) {
      ckd_free(***ppppfVar1);
      ckd_free_3d(ppppfVar1);
    }
    if (g->det != (float32 ***)0x0) {
      ckd_free_3d(g->det);
    }
    if (g->featlen != (int32 *)0x0) {
      ckd_free(g->featlen);
    }
    if (dist != (dist_t *)0x0) {
      ckd_free(dist);
    }
    ckd_free(g);
    return;
  }
  return;
}

Assistant:

void
gauden_free(gauden_t * g)
{
    if (g == NULL)
        return;
    if (g->mean)
        gauden_param_free(g->mean);
    if (g->var)
        gauden_param_free(g->var);
    if (g->det)
        ckd_free_3d((void *) g->det);
    if (g->featlen)
        ckd_free(g->featlen);
    if (dist)
        ckd_free(dist);
    ckd_free(g);
}